

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PreFilter.hpp
# Opt level: O0

Range __thiscall cppjieba::PreFilter::Next(PreFilter *this)

{
  const_iterator pRVar1;
  Range RVar2;
  bool bVar3;
  const_iterator pRVar4;
  uint *in_RDI;
  Range range;
  uint *key;
  const_iterator contain;
  const_iterator local_8;
  
  contain = *(const_iterator *)in_RDI;
  key = in_RDI;
  do {
    pRVar1 = *(const_iterator *)in_RDI;
    pRVar4 = limonp::LocalVector<cppjieba::RuneStr>::end
                       ((LocalVector<cppjieba::RuneStr> *)(in_RDI + 2));
    if (pRVar1 == pRVar4) {
      local_8 = limonp::LocalVector<cppjieba::RuneStr>::end
                          ((LocalVector<cppjieba::RuneStr> *)(in_RDI + 2));
LAB_001615c7:
      RVar2.end = local_8;
      RVar2.begin = contain;
      return RVar2;
    }
    bVar3 = std::
            IsIn<unsigned_int,std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>>
                      ((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                        *)contain,key);
    if (bVar3) {
      if (contain == *(const_iterator *)in_RDI) {
        *(long *)in_RDI = *(long *)in_RDI + 0x14;
      }
      local_8 = *(const_iterator *)in_RDI;
      goto LAB_001615c7;
    }
    *(long *)in_RDI = *(long *)in_RDI + 0x14;
  } while( true );
}

Assistant:

Range Next() {
    Range range;
    range.begin = cursor_;
    while (cursor_ != sentence_.end()) {
      if (IsIn(symbols_, cursor_->rune)) {
        if (range.begin == cursor_) {
          cursor_ ++;
        }
        range.end = cursor_;
        return range;
      }
      cursor_ ++;
    }
    range.end = sentence_.end();
    return range;
  }